

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdmiCecAnalyzerResults.cpp
# Opt level: O2

void __thiscall
HdmiCecAnalyzerResults::GenBubbleText
          (HdmiCecAnalyzerResults *this,U64 frame_index,DisplayBase display_base,bool tabular)

{
  Frame frame;
  Frame local_50 [32];
  undefined1 local_30;
  
  AnalyzerResults::ClearResultStrings();
  AnalyzerResults::GetFrame((ulonglong)local_50);
  this->mDisplayBase = display_base;
  this->mTabular = tabular;
  switch(local_30) {
  case 0:
    GenStartSeqBubble(this);
    break;
  case 1:
    GenHeaderBubble(this,local_50);
    break;
  case 2:
    GenOpCodeBubble(this,local_50);
    break;
  case 3:
    GenOperandBubble(this,local_50);
    break;
  case 4:
    GenEOMBubble(this,local_50);
    break;
  case 5:
    GenACKBubble(this,local_50);
  }
  Frame::~Frame(local_50);
  return;
}

Assistant:

void HdmiCecAnalyzerResults::GenBubbleText( U64 frame_index, DisplayBase display_base, bool tabular )
{
    ClearResultStrings();
    Frame frame = GetFrame( frame_index );
    mDisplayBase = display_base;
    mTabular = tabular;

    switch( frame.mType )
    {
    case HdmiCec::FrameType_StartSeq:
        GenStartSeqBubble();
        break;
    case HdmiCec::FrameType_Header:
        GenHeaderBubble( frame );
        break;
    case HdmiCec::FrameType_OpCode:
        GenOpCodeBubble( frame );
        break;
    case HdmiCec::FrameType_Operand:
        GenOperandBubble( frame );
        break;
    case HdmiCec::FrameType_EOM:
        GenEOMBubble( frame );
        break;
    case HdmiCec::FrameType_ACK:
        GenACKBubble( frame );
        break;
    default:
        break;
    }
}